

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::TextureParamVerifiers::GetTexParameterIVerifier::verifyInteger
          (GetTexParameterIVerifier *this,TestContext *testCtx,GLenum target,GLenum name,
          GLint reference)

{
  ostringstream *this_00;
  bool bVar1;
  StateQueryMemoryWriteGuard<int> state;
  StateQueryMemoryWriteGuard<int> local_1a8;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  local_1a8.m_preguard = -0x21212122;
  local_1a8.m_value = -0x21212122;
  local_1a8.m_postguard = -0x21212122;
  glu::CallLogWrapper::glGetTexParameteriv
            (&(this->super_TexParamVerifier).super_CallLogWrapper,target,name,&local_1a8.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&local_1a8,testCtx);
  if ((bVar1) && (local_1a8.m_value != reference)) {
    local_198._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"// ERROR: expected ",0x13);
    std::ostream::operator<<(this_00,reference);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"; got ",6);
    std::ostream::operator<<(this_00,local_1a8.m_value);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_120);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid texture param value")
      ;
    }
  }
  return;
}

Assistant:

void GetTexParameterIVerifier::verifyInteger (tcu::TestContext& testCtx, GLenum target, GLenum name, GLint reference)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint> state;
	glGetTexParameteriv(target, name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state != reference)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected " << reference << "; got " << state << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid texture param value");
	}
}